

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrSenseDataProviderTypeBD value)

{
  pointer pbVar1;
  int iVar2;
  pointer pbVar3;
  bool bVar4;
  string vuid;
  string error_str;
  string local_f0;
  string local_d0;
  string *local_b0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_a8;
  string *local_a0;
  string *local_98;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  local_b0 = command_name;
  local_a8 = objects_info;
  local_a0 = item_name;
  local_98 = validation_name;
  if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (!bVar4) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_98->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_f0);
      std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_a0->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"XrSenseDataProviderTypeBD requires extension ","");
      std::__cxx11::string::append((char *)&local_d0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_48,local_a8);
      CoreValidLogMessage(instance_info,&local_f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_b0,
                          &local_48,&local_d0);
      local_90.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_90.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      goto joined_r0x001514af;
    }
  }
  if (value == XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (bVar4) {
      return true;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_98->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_f0);
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_a0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_f0);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD\"","");
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_90,local_a8);
    CoreValidLogMessage(instance_info,&local_f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_b0,&local_90,
                        &local_d0);
  }
  else if (value == XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (bVar4) {
      return true;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_98->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_f0);
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_a0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_f0);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD\"","");
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_78,local_a8);
    CoreValidLogMessage(instance_info,&local_f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_b0,&local_78,
                        &local_d0);
    local_90.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_90.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    if (value != XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD) {
      return false;
    }
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (bVar4) {
      return true;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_98->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_f0);
    std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(local_a0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_f0);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD\"","");
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_60,local_a8);
    CoreValidLogMessage(instance_info,&local_f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_b0,&local_60,
                        &local_d0);
    local_90.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_60.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_90.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_60.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
joined_r0x001514af:
  if (local_90.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrSenseDataProviderTypeBD value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_BD_spatial_sensing, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_sensing")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrSenseDataProviderTypeBD requires extension ";
        error_str += " \"XR_BD_spatial_sensing\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD requires extension XR_BD_spatial_anchor, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_anchor")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_anchor\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD requires extension XR_BD_spatial_scene, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_scene")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_scene\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD requires extension XR_BD_spatial_mesh, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_mesh")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_mesh\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}